

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<void_(henson::NameMap_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/src/chai/data.cpp:100:30)>
::do_call(Proxy_Function_Callable_Impl<void_(henson::NameMap_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mrzv[P]henson_src_chai_data_cpp:100:30)>
          *this,vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params,
         Type_Conversions_State *t_conversions)

{
  Result_Type this_00;
  Type_Conversions_State *in_RCX;
  Type_Conversions_State *t_conversions_00;
  Boxed_Value BVar1;
  Value v;
  Result_Type local_c0;
  Value local_a0;
  data_t local_60;
  undefined4 local_28;
  
  t_conversions_00 = in_RCX;
  this_00 = boxed_cast<henson::NameMap*>
                      ((Boxed_Value *)(t_conversions->m_conversions)._M_data,in_RCX);
  boxed_cast<std::__cxx11::string>
            (&local_c0,
             (chaiscript *)
             ((((t_conversions->m_conversions)._M_data)->m_mutex).super_mutex.super___mutex_base.
              _M_mutex.__size + 0x10),(Boxed_Value *)in_RCX,t_conversions_00);
  local_60.head_.value =
       (alt<0UL,_int>)
       boxed_cast<int>((Boxed_Value *)
                       &(((t_conversions->m_conversions)._M_data)->m_mutex).super_mutex.
                        super___mutex_base._M_mutex.__data.__list.__next,in_RCX);
  local_28 = 0;
  mpark::detail::
  copy_constructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
  ::copy_constructor((copy_constructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
                      *)&local_a0,
                     (copy_constructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
                      *)&local_60.head_);
  henson::NameMap::add(this_00,&local_c0,&local_a0);
  mpark::detail::
  destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
  ::destroy((destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
             *)&local_a0);
  mpark::detail::
  destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
  ::destroy((destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
             *)&local_60.head_);
  std::__cxx11::string::~string((string *)&local_c0);
  BVar1 = detail::Handle_Return<void>::handle();
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value do_call(const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions) const CHAISCRIPT_OVERRIDE
        {
          typedef typename detail::Function_Signature<Func>::Return_Type Return_Type;
          return detail::Do_Call<Return_Type>::template go<Func>(m_f, params, t_conversions);
        }